

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::testGroupEnded
          (CumulativeReporterBase *this,TestGroupStats *testGroupStats)

{
  Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *this_00;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  node;
  value_type local_20;
  
  this_00 = (Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
             *)operator_new(0x98);
  Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  ::Node(this_00,testGroupStats);
  local_20.m_p = this_00;
  (*(this_00->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2]
  )(this_00);
  std::
  _Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this_00->children,(_Vector_impl_data *)&this->m_testCases);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ::push_back(&this->m_testGroups,&local_20);
  if (local_20.m_p !=
      (Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
       *)0x0) {
    (*((local_20.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) CATCH_OVERRIDE {
            Ptr<TestGroupNode> node = new TestGroupNode( testGroupStats );
            node->children.swap( m_testCases );
            m_testGroups.push_back( node );
        }